

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclWorker.cpp
# Opt level: O0

void __thiscall xmrig::OclWorker::start(OclWorker *this)

{
  bool bVar1;
  uint64_t uVar2;
  size_t in_RDI;
  exception *ex;
  uint64_t t;
  cl_uint results [256];
  uint32_t *in_stack_fffffffffffffb98;
  WorkerJob<1UL> *in_stack_fffffffffffffba0;
  long *in_stack_fffffffffffffba8;
  OclWorker *in_stack_fffffffffffffbb0;
  Backend in_stack_fffffffffffffbbc;
  OclSharedData *in_stack_fffffffffffffbc8;
  duration<long,_std::ratio<1L,_1000L>_> *in_stack_fffffffffffffbd0;
  int local_414;
  duration<long,std::ratio<1l,1000l>> local_410 [8];
  undefined1 local_408 [240];
  OclWorker *in_stack_fffffffffffffce8;
  int local_c;
  
  do {
    uVar2 = Nonce::sequence((Backend)((ulong)in_stack_fffffffffffffba8 >> 0x20));
    if (uVar2 == 0) {
      return;
    }
    bVar1 = isReady();
    if (!bVar1) {
      OclSharedData::setResumeCounter
                ((OclSharedData *)in_stack_fffffffffffffbb0,
                 (uint32_t)((ulong)in_stack_fffffffffffffba8 >> 0x20));
      do {
        local_414 = 200;
        std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_410,&local_414);
        std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(in_stack_fffffffffffffbd0);
        bVar1 = isReady();
        in_stack_fffffffffffffbbc = in_stack_fffffffffffffbbc & 0xffffff;
        if (!bVar1) {
          uVar2 = Nonce::sequence((Backend)((ulong)in_stack_fffffffffffffba8 >> 0x20));
          in_stack_fffffffffffffbbc = CONCAT13(uVar2 != 0,(int3)in_stack_fffffffffffffbbc);
        }
      } while ((char)(in_stack_fffffffffffffbbc >> 0x18) != '\0');
      uVar2 = Nonce::sequence((Backend)((ulong)in_stack_fffffffffffffba8 >> 0x20));
      if (uVar2 == 0) {
        return;
      }
      OclSharedData::resumeDelay(in_stack_fffffffffffffbc8,in_RDI);
      bVar1 = consumeJob(in_stack_fffffffffffffce8);
      if (!bVar1) {
        return;
      }
    }
    while( true ) {
      WorkerJob<1UL>::sequence((WorkerJob<1UL> *)(in_RDI + 0x60));
      bVar1 = Nonce::isOutdated(in_stack_fffffffffffffbbc,(uint64_t)in_stack_fffffffffffffbb0);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      OclSharedData::adjustDelay(in_stack_fffffffffffffbc8,in_RDI);
      Chrono::steadyMSecs();
      in_stack_fffffffffffffba8 = *(long **)(in_RDI + 0x48);
      in_stack_fffffffffffffbb0 =
           (OclWorker *)
           WorkerJob<1UL>::nonce(in_stack_fffffffffffffba0,(size_t)in_stack_fffffffffffffb98);
      (**(code **)(*in_stack_fffffffffffffba8 + 0x60))
                (in_stack_fffffffffffffba8,
                 *(uint32_t *)&(in_stack_fffffffffffffbb0->super_Worker).super_IWorker._vptr_IWorker
                 ,local_408);
      if (local_c != 0) {
        WorkerJob<1UL>::currentJob(in_stack_fffffffffffffba0);
        JobResults::submit((Job *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,0x215a52);
      }
      in_stack_fffffffffffffb98 = (uint32_t *)(in_RDI + 0x60);
      roundSize(*(uint32_t *)(in_RDI + 0x40));
      WorkerJob<1UL>::nextRound
                ((WorkerJob<1UL> *)in_stack_fffffffffffffbb0,
                 (uint32_t)((ulong)in_stack_fffffffffffffba8 >> 0x20),
                 (uint32_t)in_stack_fffffffffffffba8);
      storeStats(in_stack_fffffffffffffbb0,(uint64_t)in_stack_fffffffffffffba8);
      std::this_thread::yield();
    }
    bVar1 = consumeJob(in_stack_fffffffffffffce8);
  } while (bVar1);
  return;
}

Assistant:

void xmrig::OclWorker::start()
{
    cl_uint results[0x100];

    while (Nonce::sequence(Nonce::OPENCL) > 0) {
        if (!isReady()) {
            m_sharedData.setResumeCounter(0);

            do {
                std::this_thread::sleep_for(std::chrono::milliseconds(200));
            }
            while (!isReady() && Nonce::sequence(Nonce::OPENCL) > 0);

            if (Nonce::sequence(Nonce::OPENCL) == 0) {
                break;
            }

            m_sharedData.resumeDelay(m_id);

            if (!consumeJob()) {
                return;
            }
        }

        while (!Nonce::isOutdated(Nonce::OPENCL, m_job.sequence())) {
            m_sharedData.adjustDelay(m_id);

            const uint64_t t = Chrono::steadyMSecs();

            try {
                m_runner->run(*m_job.nonce(), results);
            }
            catch (std::exception &ex) {
                printError(id(), ex.what());

                return;
            }

            if (results[0xFF] > 0) {
                JobResults::submit(m_job.currentJob(), results, results[0xFF]);
            }

            m_job.nextRound(roundSize(m_intensity), m_intensity);

            storeStats(t);
            std::this_thread::yield();
        }

        if (!consumeJob()) {
            return;
        }
    }
}